

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDrawElementsBaseVertexTests.cpp
# Opt level: O1

int __thiscall
deqp::gles31::Functional::anon_unknown_0::BaseVertexGroup::init
          (BaseVertexGroup *this,EVP_PKEY_CTX *ctx)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  int iVar3;
  int extraout_EAX;
  long *plVar4;
  undefined8 *puVar5;
  DrawTest *this_00;
  long *extraout_RAX;
  ulong *puVar6;
  IndexType type;
  long lVar7;
  undefined8 uVar8;
  ulong uVar9;
  string iterationDesc;
  string desc;
  string name;
  DrawTestSpec spec;
  string local_2b0;
  long *local_290;
  undefined8 local_288;
  long local_280;
  undefined8 uStack_278;
  long *local_270;
  undefined8 local_268;
  long local_260;
  undefined8 uStack_258;
  long local_250;
  ulong *local_248;
  long local_240;
  ulong local_238 [2];
  BaseVertexGroup *local_228;
  undefined4 *local_220;
  ulong *local_218;
  long local_210;
  ulong local_208 [2];
  DrawTestSpec local_1f8;
  ulong *local_1a8;
  long local_1a0;
  ulong local_198;
  long lStack_190;
  ios_base local_138 [264];
  
  deqp::gls::DrawTestSpec::DrawTestSpec(&local_1f8);
  local_228 = this;
  genBasicSpec(&local_1f8,this->m_method);
  local_1f8.indexStorage = STORAGE_BUFFER;
  paVar1 = &local_2b0.field_2;
  local_220 = &DAT_01cccc78;
  local_250 = 0;
  do {
    local_290 = &local_280;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"index_","");
    lVar7 = local_250 * 0x10;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_290);
    puVar6 = (ulong *)(plVar4 + 2);
    if ((ulong *)*plVar4 == puVar6) {
      local_198 = *puVar6;
      lStack_190 = plVar4[3];
      local_1a8 = &local_198;
    }
    else {
      local_198 = *puVar6;
      local_1a8 = (ulong *)*plVar4;
    }
    local_1a0 = plVar4[1];
    *plVar4 = (long)puVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    uVar2 = *(uint *)(&DAT_01cccc74 + lVar7);
    deqp::gls::DrawTestSpec::indexTypeToString_abi_cxx11_
              (&local_2b0,(DrawTestSpec *)(ulong)uVar2,(IndexType)local_1a0);
    uVar9 = 0xf;
    if (local_1a8 != &local_198) {
      uVar9 = local_198;
    }
    if (uVar9 < local_2b0._M_string_length + local_1a0) {
      uVar8 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_dataplus._M_p != paVar1) {
        uVar8 = local_2b0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar8 < local_2b0._M_string_length + local_1a0) goto LAB_016a0892;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_2b0,0,(char *)0x0,(ulong)local_1a8);
    }
    else {
LAB_016a0892:
      puVar5 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_1a8,(ulong)local_2b0._M_dataplus._M_p)
      ;
    }
    local_270 = &local_260;
    plVar4 = puVar5 + 2;
    if ((long *)*puVar5 == plVar4) {
      local_260 = *plVar4;
      uStack_258 = puVar5[3];
    }
    else {
      local_260 = *plVar4;
      local_270 = (long *)*puVar5;
    }
    local_268 = puVar5[1];
    *puVar5 = plVar4;
    puVar5[1] = 0;
    *(undefined1 *)plVar4 = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != paVar1) {
      operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
    }
    if (local_1a8 != &local_198) {
      operator_delete(local_1a8,local_198 + 1);
    }
    if (local_290 != &local_280) {
      operator_delete(local_290,local_280 + 1);
    }
    local_1a8 = &local_198;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"index ","");
    deqp::gls::DrawTestSpec::indexTypeToString_abi_cxx11_
              (&local_2b0,(DrawTestSpec *)(ulong)uVar2,type);
    uVar9 = 0xf;
    if (local_1a8 != &local_198) {
      uVar9 = local_198;
    }
    if (uVar9 < local_2b0._M_string_length + local_1a0) {
      uVar8 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_dataplus._M_p != paVar1) {
        uVar8 = local_2b0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar8 < local_2b0._M_string_length + local_1a0) goto LAB_016a09b7;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_2b0,0,(char *)0x0,(ulong)local_1a8);
    }
    else {
LAB_016a09b7:
      puVar5 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_1a8,(ulong)local_2b0._M_dataplus._M_p)
      ;
    }
    local_290 = &local_280;
    plVar4 = puVar5 + 2;
    if ((long *)*puVar5 == plVar4) {
      local_280 = *plVar4;
      uStack_278 = puVar5[3];
    }
    else {
      local_280 = *plVar4;
      local_290 = (long *)*puVar5;
    }
    local_288 = puVar5[1];
    *puVar5 = plVar4;
    puVar5[1] = 0;
    *(undefined1 *)plVar4 = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != paVar1) {
      operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
    }
    if (local_1a8 != &local_198) {
      operator_delete(local_1a8,local_198 + 1);
    }
    this_00 = (DrawTest *)operator_new(0x138);
    deqp::gls::DrawTest::DrawTest
              (this_00,(local_228->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx
               ,((local_228->super_TestCaseGroup).m_context)->m_renderCtx,(char *)local_270,
               (char *)local_290);
    local_1f8.indexType = *(IndexType *)(&DAT_01cccc74 + lVar7);
    lVar7 = 0;
    do {
      local_218 = local_208;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"base vertex ","");
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      iVar3 = local_220[lVar7];
      std::ostream::operator<<((ostringstream *)&local_1a8,iVar3);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
      std::ios_base::~ios_base(local_138);
      uVar9 = 0xf;
      if (local_218 != local_208) {
        uVar9 = local_208[0];
      }
      if (uVar9 < (ulong)(local_240 + local_210)) {
        uVar9 = 0xf;
        if (local_248 != local_238) {
          uVar9 = local_238[0];
        }
        if (uVar9 < (ulong)(local_240 + local_210)) goto LAB_016a0b50;
        puVar5 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_248,0,(char *)0x0,(ulong)local_218);
      }
      else {
LAB_016a0b50:
        puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_218,(ulong)local_248);
      }
      puVar6 = puVar5 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar6) {
        local_2b0.field_2._M_allocated_capacity = *puVar6;
        local_2b0.field_2._8_8_ = puVar5[3];
        local_2b0._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_2b0.field_2._M_allocated_capacity = *puVar6;
        local_2b0._M_dataplus._M_p = (pointer)*puVar5;
      }
      local_2b0._M_string_length = puVar5[1];
      *puVar5 = puVar6;
      puVar5[1] = 0;
      *(undefined1 *)puVar6 = 0;
      if (local_248 != local_238) {
        operator_delete(local_248,local_238[0] + 1);
      }
      if (local_218 != local_208) {
        operator_delete(local_218,local_208[0] + 1);
      }
      local_1f8.baseVertex = iVar3;
      deqp::gls::DrawTest::addIteration(this_00,&local_1f8,local_2b0._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_dataplus._M_p != paVar1) {
        operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 == 1);
    tcu::TestNode::addChild((TestNode *)local_228,(TestNode *)this_00);
    if (local_290 != &local_280) {
      operator_delete(local_290,local_280 + 1);
    }
    plVar4 = &local_260;
    if (local_270 != plVar4) {
      operator_delete(local_270,local_260 + 1);
      plVar4 = extraout_RAX;
    }
    iVar3 = (int)plVar4;
    local_250 = local_250 + 1;
    local_220 = local_220 + 4;
    if (local_250 == 6) {
      if (local_1f8.attribs.
          super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1f8.attribs.
                        super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_1f8.attribs.
                              super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_1f8.attribs.
                              super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                              ._M_impl.super__Vector_impl_data._M_start);
        iVar3 = extraout_EAX;
      }
      return iVar3;
    }
  } while( true );
}

Assistant:

void BaseVertexGroup::init (void)
{
	struct IndexTest
	{
		bool							positiveBase;
		gls::DrawTestSpec::IndexType	type;
		int								baseVertex[2];
	};

	const IndexTest tests[] =
	{
		{ true,  gls::DrawTestSpec::INDEXTYPE_BYTE,		{  1,  2 } },
		{ true,  gls::DrawTestSpec::INDEXTYPE_SHORT,	{  1,  2 } },
		{ true,  gls::DrawTestSpec::INDEXTYPE_INT,		{  1,  2 } },
		{ false, gls::DrawTestSpec::INDEXTYPE_BYTE,		{ -1, -2 } },
		{ false, gls::DrawTestSpec::INDEXTYPE_SHORT,	{ -1, -2 } },
		{ false, gls::DrawTestSpec::INDEXTYPE_INT,		{ -1, -2 } },
	};

	gls::DrawTestSpec spec;
	genBasicSpec(spec, m_method);

	spec.indexStorage = gls::DrawTestSpec::STORAGE_BUFFER;

	for (int testNdx = 0; testNdx < DE_LENGTH_OF_ARRAY(tests); ++testNdx)
	{
		const IndexTest&	indexTest	= tests[testNdx];

		const std::string	name		= std::string("index_") + (indexTest.positiveBase ? "" : "neg_") + gls::DrawTestSpec::indexTypeToString(indexTest.type);
		const std::string	desc		= std::string("index ") + gls::DrawTestSpec::indexTypeToString(indexTest.type);
		gls::DrawTest*		test		= new gls::DrawTest(m_testCtx, m_context.getRenderContext(), name.c_str(), desc.c_str());

		spec.indexType			= indexTest.type;

		for (int iterationNdx = 0; iterationNdx < DE_LENGTH_OF_ARRAY(indexTest.baseVertex); ++iterationNdx)
		{
			const std::string iterationDesc = std::string("base vertex ") + de::toString(indexTest.baseVertex[iterationNdx]);
			spec.baseVertex	= indexTest.baseVertex[iterationNdx];
			test->addIteration(spec, iterationDesc.c_str());
		}

		addChild(test);
	}
}